

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

GatherAlongAxisLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::GatherAlongAxisLayerParams>
          (Arena *arena)

{
  GatherAlongAxisLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (GatherAlongAxisLayerParams *)operator_new(0x20);
    CoreML::Specification::GatherAlongAxisLayerParams::GatherAlongAxisLayerParams
              (this,(Arena *)0x0,false);
  }
  else {
    this = (GatherAlongAxisLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x20,
                      (type_info *)&CoreML::Specification::GatherAlongAxisLayerParams::typeinfo);
    CoreML::Specification::GatherAlongAxisLayerParams::GatherAlongAxisLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }